

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  vector<generator::a_t,_std::allocator<generator::a_t>_> list;
  a_t a;
  string_t content;
  b_t local_338;
  ofstream out;
  int aiStack_2f8 [120];
  tag_b_t<cfgfile::string_trait_t> tag;
  
  local_338.m_a_vector.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.m_a_vector.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.m_a_vector.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  list.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.m_integer_field = 100;
  list.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  list.super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  a.m_string_field._M_dataplus._M_p = (pointer)&a.m_string_field.field_2;
  a.m_string_field._M_string_length = 0;
  a.m_string_field.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&out,"string",(allocator *)&tag);
  std::__cxx11::string::_M_assign((string *)&a);
  std::__cxx11::string::~string((string *)&out);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::push_back(&list,&a);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::operator=
            (&local_338.m_a_vector,&list);
  std::ofstream::ofstream(&out,"generator.cfg",_S_out);
  generator::tag_b_t<cfgfile::string_trait_t>::tag_b_t(&tag,&local_338);
  iVar1 = *(int *)((long)aiStack_2f8 + *(long *)(_out + -0x18));
  if (iVar1 == 0) {
    (*tag.super_tag_scalar_t<int,_cfgfile::string_trait_t>.super_tag_t<cfgfile::string_trait_t>.
      _vptr_tag_t[3])(&content,&tag,0);
    std::operator<<((ostream *)&out,(string *)&content);
    std::__cxx11::string::~string((string *)&content);
    std::ofstream::close();
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Fialed to save configuration. Can\'t open file to write.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar3 = (uint)(iVar1 != 0);
  generator::tag_b_t<cfgfile::string_trait_t>::~tag_b_t(&tag);
  if (iVar1 == 0) {
    uVar3 = 0;
    std::operator<<((ostream *)&std::cout,"Configuration saved to \"generator.cfg\".\n");
  }
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::~string((string *)&a);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::~vector(&list);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::~vector(&local_338.m_a_vector);
  return uVar3;
}

Assistant:

int main()
{
	generator::b_t b;
	b.set_integer_field( 100 );

	std::vector< generator::a_t > list;
	generator::a_t a;
	a.set_string_field( "string" );
	list.push_back( a );

	b.set_a_vector( list );

	std::ofstream out( "generator.cfg" );

	try {
		generator::tag_b_t< cfgfile::string_trait_t > tag( b );

		if( out.good() )
		{
			cfgfile::write_cfgfile( tag, out );

			out.close();
		}
		else
		{
			std::cout << "Fialed to save configuration. Can't open file to write."
				<< std::endl;

			return 1;
		}
	}
	catch( const cfgfile::exception_t< cfgfile::string_trait_t > & x )
	{
		out.close();

		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::cout << "Configuration saved to \"generator.cfg\".\n";

	return 0;
}